

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.h
# Opt level: O1

void __thiscall Am_Assoc_Data::Am_Assoc_Data(Am_Assoc_Data *this,Am_Value *val1,Am_Value *val2)

{
  *(undefined4 *)(this + 8) = 1;
  *(code **)this = Am_Object::Add;
  *(undefined2 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined2 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  Am_Value::operator=((Am_Value *)(this + 0x10),val1);
  Am_Value::operator=((Am_Value *)(this + 0x20),val2);
  return;
}

Assistant:

Am_Assoc_Data(const Am_Value &val1, const Am_Value &val2)
  {
    value_1 = val1;
    value_2 = val2;
  }